

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgenericunixtheme.cpp
# Opt level: O2

QIcon __thiscall QGenericUnixTheme::xdgFileIcon(QGenericUnixTheme *this,QFileInfo *fileInfo)

{
  char cVar1;
  bool bVar2;
  long in_FS_OFFSET;
  QMimeType mimeType;
  QMimeDatabase mimeDatabase;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char16_t> local_58;
  undefined1 *local_40;
  undefined1 *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  QMimeDatabase::QMimeDatabase((QMimeDatabase *)&local_38);
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  QMimeDatabase::mimeTypeForFile(&local_40,(QMimeDatabase *)&local_38,fileInfo,0);
  cVar1 = QMimeType::isValid();
  if (cVar1 == '\0') {
    QIcon::QIcon((QIcon *)this);
    goto LAB_0058756d;
  }
  QMimeType::iconName();
  if (local_58.size == 0) {
LAB_0058751f:
    QMimeType::genericIconName();
    if (local_70.size == 0) {
      QIcon::QIcon((QIcon *)this);
    }
    else {
      QIcon::fromTheme((QIcon *)this,(QString *)&local_70);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  }
  else {
    (this->super_QPlatformTheme)._vptr_QPlatformTheme = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
    QIcon::fromTheme((QIcon *)this,(QString *)&local_58);
    bVar2 = QIcon::isNull((QIcon *)this);
    if (bVar2) {
      QIcon::~QIcon((QIcon *)this);
      goto LAB_0058751f;
    }
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
LAB_0058756d:
  QMimeType::~QMimeType((QMimeType *)&local_40);
  QMimeDatabase::~QMimeDatabase((QMimeDatabase *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QIcon)(QIconPrivate *)this;
  }
  __stack_chk_fail();
}

Assistant:

QIcon QGenericUnixTheme::xdgFileIcon(const QFileInfo &fileInfo)
{
    QMimeDatabase mimeDatabase;
    QMimeType mimeType = mimeDatabase.mimeTypeForFile(fileInfo);
    if (!mimeType.isValid())
        return QIcon();
    const QString &iconName = mimeType.iconName();
    if (!iconName.isEmpty()) {
        QIcon icon = QIcon::fromTheme(iconName);
        if (!icon.isNull())
            return icon;
    }
    const QString &genericIconName = mimeType.genericIconName();
    return genericIconName.isEmpty() ? QIcon() : QIcon::fromTheme(genericIconName);
}